

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool anon_unknown.dwarf_14023::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  bool bVar1;
  char *__s2;
  char *__s1;
  int iVar2;
  char *local_48;
  ptrdiff_t r;
  char *beginr;
  char *beginl;
  char *endr;
  char *endl;
  char *rhss_local;
  char *lhss_local;
  CompareOp op_local;
  
  beginl = rhss;
  endr = lhss;
  while( true ) {
    if (((*endr < '0') || (bVar1 = true, '9' < *endr)) && (bVar1 = false, '/' < *beginl)) {
      bVar1 = *beginl < ':';
    }
    if (!bVar1) {
      return (op & OP_EQUAL) != 0;
    }
    for (; __s1 = endr, *endr == '0'; endr = endr + 1) {
    }
    for (; __s2 = beginl, *beginl == '0'; beginl = beginl + 1) {
    }
    while( true ) {
      bVar1 = false;
      if ('/' < *endr) {
        bVar1 = *endr < ':';
      }
      if (!bVar1) break;
      endr = endr + 1;
    }
    while( true ) {
      bVar1 = false;
      if ('/' < *beginl) {
        bVar1 = *beginl < ':';
      }
      if (!bVar1) break;
      beginl = beginl + 1;
    }
    local_48 = endr + (-((long)beginl - (long)__s2) - (long)__s1);
    if (local_48 == (char *)0x0) {
      iVar2 = strncmp(__s1,__s2,(long)endr - (long)__s1);
      local_48 = (char *)(long)iVar2;
    }
    if ((long)local_48 < 0) break;
    if (0 < (long)local_48) {
      return (op & OP_GREATER) != 0;
    }
    if (*beginl == '.') {
      beginl = beginl + 1;
    }
    if (*endr == '.') {
      endr = endr + 1;
    }
  }
  return (op & OP_LESS) != 0;
}

Assistant:

bool VersionCompare(cmSystemTools::CompareOp op, const char* lhss,
                    const char* rhss)
{
  const char* endl = lhss;
  const char* endr = rhss;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9'))) {
    // Do component-wise comparison, ignoring leading zeros
    // (components are treated as integers, not as mantissas)
    while (*endl == '0') {
      endl++;
    }
    while (*endr == '0') {
      endr++;
    }

    const char* beginl = endl;
    const char* beginr = endr;

    // count significant digits
    while ((*endl >= '0') && (*endl <= '9')) {
      endl++;
    }
    while ((*endr >= '0') && (*endr <= '9')) {
      endr++;
    }

    // compare number of digits first
    ptrdiff_t r = ((endl - beginl) - (endr - beginr));
    if (r == 0) {
      // compare the digits if number of digits is equal
      r = strncmp(beginl, beginr, endl - beginl);
    }

    if (r < 0) {
      // lhs < rhs, so true if operation is LESS
      return (op & cmSystemTools::OP_LESS) != 0;
    }
    if (r > 0) {
      // lhs > rhs, so true if operation is GREATER
      return (op & cmSystemTools::OP_GREATER) != 0;
    }

    if (*endr == '.') {
      endr++;
    }

    if (*endl == '.') {
      endl++;
    }
  }
  // lhs == rhs, so true if operation is EQUAL
  return (op & cmSystemTools::OP_EQUAL) != 0;
}